

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_haxe_generator.cc
# Opt level: O1

void __thiscall
t_haxe_generator::generate_serialize_container
          (t_haxe_generator *this,ostream *out,t_type *ttype,string *prefix)

{
  pointer pcVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  t_haxe_generator *this_00;
  _Alloc_hider _Var5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  string iter;
  string counter;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar2 == '\0') {
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar2 != '\0') {
      poVar3 = t_generator::indent((t_generator *)this,out);
      pcVar4 = "oprot.writeSetBegin(new TSet(";
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"oprot.writeSetBegin(new TSet(",0x1d);
      type_to_enum_abi_cxx11_
                (&local_190,(t_haxe_generator *)pcVar4,*(t_type **)&ttype[1].super_t_doc.has_doc_);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_190._M_dataplus._M_p,local_190._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,".size));",8);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      goto LAB_002337a1;
    }
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar2 != '\0') {
      poVar3 = t_generator::indent((t_generator *)this,out);
      pcVar4 = "oprot.writeListBegin(new TList(";
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"oprot.writeListBegin(new TList(",0x1f);
      type_to_enum_abi_cxx11_
                (&local_190,(t_haxe_generator *)pcVar4,*(t_type **)&ttype[1].super_t_doc.has_doc_);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_190._M_dataplus._M_p,local_190._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,".length));",10);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      goto LAB_002337a1;
    }
  }
  else {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"_key","");
    t_generator::tmp(&local_190,(t_generator *)this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"_sizeCounter","");
    t_generator::tmp(&local_170,(t_generator *)this,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    poVar3 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"var ",4);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_170._M_dataplus._M_p,local_170._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," : Int = 0;",0xb);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar3 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"for( ",5);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_190._M_dataplus._M_p,local_190._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," in ",4);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,") {",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar3 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"  ",2);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_170._M_dataplus._M_p,local_170._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"++;",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar3 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"}",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    poVar3 = t_generator::indent((t_generator *)this,out);
    pcVar4 = "oprot.writeMapBegin(new TMap(";
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"oprot.writeMapBegin(new TMap(",0x1d);
    type_to_enum_abi_cxx11_
              (&local_90,(t_haxe_generator *)pcVar4,*(t_type **)&ttype[1].super_t_doc.has_doc_);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_90._M_dataplus._M_p,local_90._M_string_length);
    this_00 = (t_haxe_generator *)0x3a9b9f;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    type_to_enum_abi_cxx11_(&local_b0,this_00,*(t_type **)&ttype[1].annotations_._M_t._M_impl);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_b0._M_dataplus._M_p,local_b0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_170._M_dataplus._M_p,local_170._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"));",3);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
LAB_002337a1:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p);
    }
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"elem","");
  t_generator::tmp(&local_190,(t_generator *)this,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar2 == '\0') {
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar2 != '\0') {
      poVar3 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"for( ",5);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_190._M_dataplus._M_p,local_190._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," in ",4);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,".toArray())",0xb);
      goto LAB_00233993;
    }
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
    if ((char)iVar2 != '\0') {
      poVar3 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"for( ",5);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_190._M_dataplus._M_p,local_190._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," in ",4);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,")",1);
      goto LAB_00233993;
    }
  }
  else {
    poVar3 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"for( ",5);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_190._M_dataplus._M_p,local_190._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," in ",4);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(prefix->_M_dataplus)._M_p,prefix->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,".keys())",8);
LAB_00233993:
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  }
  t_oop_generator::scope_up(&this->super_t_oop_generator,out);
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar2 == '\0') {
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar2 == '\0') {
      iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
      if ((char)iVar2 == '\0') goto LAB_00233af1;
      paVar6 = &local_150.field_2;
      local_150._M_dataplus._M_p = (pointer)paVar6;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_150,local_190._M_dataplus._M_p,
                 local_190._M_dataplus._M_p + local_190._M_string_length);
      generate_serialize_list_element(this,out,(t_list *)ttype,&local_150);
      _Var5._M_p = local_150._M_dataplus._M_p;
    }
    else {
      paVar6 = &local_130.field_2;
      local_130._M_dataplus._M_p = (pointer)paVar6;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_130,local_190._M_dataplus._M_p,
                 local_190._M_dataplus._M_p + local_190._M_string_length);
      generate_serialize_set_element(this,out,(t_set *)ttype,&local_130);
      _Var5._M_p = local_130._M_dataplus._M_p;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var5._M_p != paVar6) goto LAB_00233aec;
  }
  else {
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,local_190._M_dataplus._M_p,
               local_190._M_dataplus._M_p + local_190._M_string_length);
    pcVar1 = (prefix->_M_dataplus)._M_p;
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,pcVar1,pcVar1 + prefix->_M_string_length);
    generate_serialize_map_element(this,out,(t_map *)ttype,&local_f0,&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    _Var5._M_p = local_f0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
LAB_00233aec:
      operator_delete(_Var5._M_p);
    }
  }
LAB_00233af1:
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0x10])(ttype);
  if ((char)iVar2 == '\0') {
    iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xf])(ttype);
    if ((char)iVar2 == '\0') {
      iVar2 = (*(ttype->super_t_doc)._vptr_t_doc[0xe])(ttype);
      if ((char)iVar2 == '\0') goto LAB_00233ba6;
      poVar3 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"oprot.writeListEnd();",0x15);
    }
    else {
      poVar3 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"oprot.writeSetEnd();",0x14);
    }
  }
  else {
    poVar3 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"oprot.writeMapEnd();",0x14);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
LAB_00233ba6:
  t_oop_generator::scope_down(&this->super_t_oop_generator,out);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_haxe_generator::generate_serialize_container(ostream& out, t_type* ttype, string prefix) {
  scope_up(out);

  if (ttype->is_map()) {
    string iter = tmp("_key");
    string counter = tmp("_sizeCounter");
    indent(out) << "var " << counter << " : Int = 0;" << endl;
    indent(out) << "for( " << iter << " in " << prefix << ") {" << endl;
    indent(out) << "  " << counter << +"++;" << endl;
    indent(out) << "}" << endl;

    indent(out) << "oprot.writeMapBegin(new TMap(" << type_to_enum(((t_map*)ttype)->get_key_type())
                << ", " << type_to_enum(((t_map*)ttype)->get_val_type()) << ", " << counter << "));"
                << endl;
  } else if (ttype->is_set()) {
    indent(out) << "oprot.writeSetBegin(new TSet(" << type_to_enum(((t_set*)ttype)->get_elem_type())
                << ", " << prefix << ".size));" << endl;
  } else if (ttype->is_list()) {
    indent(out) << "oprot.writeListBegin(new TList("
                << type_to_enum(((t_list*)ttype)->get_elem_type()) << ", " << prefix << ".length));"
                << endl;
  }

  string iter = tmp("elem");
  if (ttype->is_map()) {
    indent(out) << "for( " << iter << " in " << prefix << ".keys())" << endl;
  } else if (ttype->is_set()) {
    indent(out) << "for( " << iter << " in " << prefix << ".toArray())" << endl;
  } else if (ttype->is_list()) {
    indent(out) << "for( " << iter << " in " << prefix << ")" << endl;
  }

  scope_up(out);

  if (ttype->is_map()) {
    generate_serialize_map_element(out, (t_map*)ttype, iter, prefix);
  } else if (ttype->is_set()) {
    generate_serialize_set_element(out, (t_set*)ttype, iter);
  } else if (ttype->is_list()) {
    generate_serialize_list_element(out, (t_list*)ttype, iter);
  }

  scope_down(out);

  if (ttype->is_map()) {
    indent(out) << "oprot.writeMapEnd();" << endl;
  } else if (ttype->is_set()) {
    indent(out) << "oprot.writeSetEnd();" << endl;
  } else if (ttype->is_list()) {
    indent(out) << "oprot.writeListEnd();" << endl;
  }

  scope_down(out);
}